

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool GlobOpt::DoFloatTypeSpec(Func *func)

{
  bool bVar1;
  uint sourceContextId;
  uint functionId;
  BOOL BVar2;
  JITTimeProfileInfo *this;
  bool local_11;
  Func *func_local;
  
  sourceContextId = Func::GetSourceContextId(func);
  functionId = Func::GetLocalFunctionId(func);
  bVar1 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01eafdf0,FloatTypeSpecPhase,sourceContextId,functionId);
  local_11 = false;
  if (!bVar1) {
    bVar1 = IsTypeSpecPhaseOff(func);
    local_11 = false;
    if (!bVar1) {
      bVar1 = Func::HasProfileInfo(func);
      if (bVar1) {
        this = Func::GetReadOnlyProfileInfo(func);
        bVar1 = JITTimeProfileInfo::IsFloatTypeSpecDisabled(this);
        if (bVar1) {
          return false;
        }
      }
      BVar2 = AutoSystemInfo::SSE2Available(&AutoSystemInfo::Data);
      local_11 = BVar2 != 0;
    }
  }
  return local_11;
}

Assistant:

bool
GlobOpt::DoFloatTypeSpec(Func const * func)
{
    return
        !PHASE_OFF(Js::FloatTypeSpecPhase, func) &&
        !IsTypeSpecPhaseOff(func) &&
        (!func->HasProfileInfo() || !func->GetReadOnlyProfileInfo()->IsFloatTypeSpecDisabled()) &&
        AutoSystemInfo::Data.SSE2Available();
}